

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

pool_ptr<soul::AST::Function> __thiscall
soul::ResolutionPass::GenericFunctionResolver::getOrCreateSpecialisedFunction
          (GenericFunctionResolver *this,CallOrCast *call,Function *genericFunction,
          ArrayView<soul::Type> callerArgumentTypes,bool shouldIgnoreErrors)

{
  Allocator *this_00;
  bool bVar1;
  __type_conflict1 _Var2;
  int iVar3;
  undefined4 extraout_var;
  Function *function;
  string *__rhs;
  Identifier IVar5;
  Function *function_00;
  TypeArray *types;
  undefined7 in_register_00000089;
  undefined8 *puVar6;
  undefined1 auVar7 [16];
  ArrayView<soul::Type> callerArgumentTypes_00;
  bool in_stack_00000008;
  string callerSignatureID;
  TypeArray resolvedTypes;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  string local_128;
  undefined1 local_108 [216];
  long *plVar4;
  
  callerArgumentTypes_00.e._1_7_ = in_register_00000089;
  callerArgumentTypes_00.e._0_1_ = shouldIgnoreErrors;
  function_00 = (Function *)callerArgumentTypes.s;
  iVar3 = (*(function_00->super_ASTObject)._vptr_ASTObject[3])(function_00);
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  if (plVar4 == (long *)0x0) {
    throwInternalCompilerError("parentScope != nullptr","getOrCreateSpecialisedFunction",0xaa1);
  }
  local_108._0_8_ = local_108 + 0x18;
  local_108._8_8_ = 0;
  local_108._16_8_ = 8;
  callerArgumentTypes_00.s = callerArgumentTypes.e;
  bVar1 = findGenericFunctionTypes
                    ((GenericFunctionResolver *)call,(CallOrCast *)genericFunction,function_00,
                     callerArgumentTypes_00,(TypeArray *)local_108,in_stack_00000008);
  if (bVar1) {
    ASTUtilities::getTypeArraySignature_abi_cxx11_(&local_128,(ASTUtilities *)local_108,types);
    auVar7 = (**(code **)(*plVar4 + 0x68))(plVar4);
    for (puVar6 = auVar7._0_8_; puVar6 != auVar7._8_8_; puVar6 = puVar6 + 1) {
      if ((((Function *)*puVar6)->originalGenericFunction).object == function_00) {
        getIDStringForFunction_abi_cxx11_
                  (&local_168,(GenericFunctionResolver *)call,(Function *)*puVar6);
        _Var2 = std::operator==(&local_168,&local_128);
        std::__cxx11::string::~string((string *)&local_168);
        if (_Var2) {
          function = (Function *)*puVar6;
          goto LAB_0022b06f;
        }
      }
    }
    function = StructuralParser::cloneFunction
                         ((Allocator *)
                          (call->super_CallOrCastBase).super_Expression.super_Statement.
                          super_ASTObject.context.location.location.data,function_00);
    this_00 = (Allocator *)
              (call->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
              location.location.data;
    __rhs = Identifier::toString_abi_cxx11_(&function_00->name);
    std::operator+(&local_148,"_",__rhs);
    std::operator+(&local_168,&local_148,"_specialised");
    IVar5 = AST::Allocator::get<std::__cxx11::string>(this_00,&local_168);
    (function->name).name = IVar5.name;
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    (function->originalGenericFunction).object = function_00;
    applyGenericFunctionTypes((GenericFunctionResolver *)call,function,(TypeArray *)local_108);
LAB_0022b06f:
    (this->super_FunctionResolver).super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
    _vptr_RewritingASTVisitor = (_func_int **)function;
    std::__cxx11::string::~string((string *)&local_128);
  }
  else {
    (this->super_FunctionResolver).super_ErrorIgnoringRewritingASTVisitor.super_RewritingASTVisitor.
    _vptr_RewritingASTVisitor = (_func_int **)0x0;
  }
  ArrayWithPreallocation<soul::Type,_8UL>::clear
            ((ArrayWithPreallocation<soul::Type,_8UL> *)local_108);
  return (pool_ptr<soul::AST::Function>)(Function *)this;
}

Assistant:

pool_ptr<AST::Function> getOrCreateSpecialisedFunction (AST::CallOrCast& call,
                                                                AST::Function& genericFunction,
                                                                ArrayView<Type> callerArgumentTypes,
                                                                bool shouldIgnoreErrors)
        {
            auto parentScope = genericFunction.getParentScope();
            SOUL_ASSERT (parentScope != nullptr);

            AST::TypeArray resolvedTypes;

            if (findGenericFunctionTypes (call, genericFunction, callerArgumentTypes, resolvedTypes, shouldIgnoreErrors))
            {
                auto callerSignatureID = ASTUtilities::getTypeArraySignature (resolvedTypes);

                for (auto& f : parentScope->getFunctions())
                    if (f->originalGenericFunction == genericFunction && getIDStringForFunction (f) == callerSignatureID)
                        return f;

                auto& newFunction = StructuralParser::cloneFunction (allocator, genericFunction);
                newFunction.name = allocator.get ("_" + genericFunction.name.toString() + heart::getGenericSpecialisationNameTag());
                newFunction.originalGenericFunction = genericFunction;
                applyGenericFunctionTypes (newFunction, resolvedTypes);

                return newFunction;
            }

            return {};
        }